

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_handler_set_host(nng_http_handler *h,char *host)

{
  char *host_local;
  nng_http_handler *h_local;
  
  nni_http_handler_set_host(h,host);
  return;
}

Assistant:

void
nng_http_handler_set_host(nng_http_handler *h, const char *host)
{
#ifdef NNG_SUPP_HTTP
	nni_http_handler_set_host(h, host);
#else
	NNI_ARG_UNUSED(h);
	NNI_ARG_UNUSED(host);
#endif
}